

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O0

void __thiscall
S2ShapeIndexRegion<MutableS2ShapeIndex>::S2ShapeIndexRegion
          (S2ShapeIndexRegion<MutableS2ShapeIndex> *this,MutableS2ShapeIndex *index)

{
  MutableS2ShapeIndex *index_00;
  Iterator *pIVar1;
  S2ContainsPointQueryOptions local_1c;
  MutableS2ShapeIndex *local_18;
  MutableS2ShapeIndex *index_local;
  S2ShapeIndexRegion<MutableS2ShapeIndex> *this_local;
  
  local_18 = index;
  index_local = (MutableS2ShapeIndex *)this;
  S2Region::S2Region(&this->super_S2Region);
  index_00 = local_18;
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexRegion_0062eb50;
  S2ContainsPointQueryOptions::S2ContainsPointQueryOptions(&local_1c);
  S2ContainsPointQuery<MutableS2ShapeIndex>::S2ContainsPointQuery
            (&this->contains_query_,index_00,&local_1c);
  pIVar1 = S2ContainsPointQuery<MutableS2ShapeIndex>::mutable_iter(&this->contains_query_);
  this->iter_ = pIVar1;
  return;
}

Assistant:

S2ShapeIndexRegion<IndexType>::S2ShapeIndexRegion(const IndexType* index)
    : contains_query_(index) {
}